

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::
FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>::Delete
          (FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
           *this,Index index)

{
  ulong *puVar1;
  pointer puVar2;
  tuple<wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_> tVar3;
  iterator __position;
  Index IVar4;
  Index local_18;
  
  puVar2 = (this->list_).
           super__Vector_base<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>,_std::allocator<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  tVar3.super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
  super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_> *)
        &puVar2[index]._M_t.
         super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>;
  puVar2[index]._M_t.
  super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> =
       (__uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>)0x0;
  local_18 = index;
  if (tVar3.
      super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>.
      super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wabt::interp::Object_*,_false>)0x0) {
    (**(code **)(*(long *)tVar3.
                          super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                          .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl + 8))()
    ;
  }
  IVar4 = index + 0x3f;
  if (-1 < (long)index) {
    IVar4 = index;
  }
  puVar1 = (this->is_free_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           ((long)IVar4 >> 6) +
           (ulong)((index & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)index & 0x3f);
  __position._M_current =
       (this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->free_,__position,
               &local_18);
  }
  else {
    *__position._M_current = index;
    (this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void FreeList<T>::Delete(Index index) {
  list_[index] = T();
  is_free_[index] = true;
  free_.push_back(index);
}